

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLibraryCommand.cxx
# Opt level: O3

bool __thiscall
cmAddLibraryCommand::InitialPass
          (cmAddLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  PolicyStatus PVar5;
  char *pcVar6;
  undefined8 uVar7;
  ostream *poVar8;
  cmState *this_00;
  long lVar9;
  cmTarget *pcVar10;
  pointer pbVar11;
  PolicyID id;
  MessageType t;
  TargetType type;
  int iVar12;
  cmCommand *this_01;
  pointer pbVar13;
  string libType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  string libName;
  ostringstream e;
  string local_228;
  string local_208;
  uint local_1e8;
  uint local_1e4;
  cmCommand *local_1e0;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar6 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar6;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((char *)local_1a8._0_8_ != pcVar6) {
      operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    }
    return false;
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"BUILD_SHARED_LIBS","");
  pcVar6 = cmMakefile::GetDefinition(pcVar1,(string *)local_1a8);
  bVar3 = cmSystemTools::IsOff(pcVar6);
  local_1e0 = &this->super_cmCommand;
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
  type = SHARED_LIBRARY - bVar3;
  pbVar13 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  pcVar2 = (pbVar13->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar2,pcVar2 + pbVar13->_M_string_length);
  pbVar13 = pbVar13 + 1;
  local_1d0 = 0;
  local_1e4 = 0;
  local_1cc = 0;
  local_1e8 = 0;
  local_1d4 = 0;
  do {
    if (pbVar13 ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) goto LAB_002755d1;
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    pcVar2 = (pbVar13->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,pcVar2,pcVar2 + pbVar13->_M_string_length);
    uVar7 = std::__cxx11::string::compare((char *)&local_228);
    if ((int)uVar7 == 0) {
      if (type != INTERFACE_LIBRARY) {
        type = STATIC_LIBRARY;
        goto LAB_0027539f;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"INTERFACE library specified with conflicting STATIC type.",
                 0x39);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(local_1e0,&local_208);
LAB_00275454:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      type = INTERFACE_LIBRARY;
LAB_00275491:
      iVar12 = 1;
    }
    else {
      uVar7 = std::__cxx11::string::compare((char *)&local_228);
      if ((int)uVar7 == 0) {
        if (type == INTERFACE_LIBRARY) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "INTERFACE library specified with conflicting SHARED type.",0x39);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(local_1e0,&local_208);
          goto LAB_00275454;
        }
        type = SHARED_LIBRARY;
      }
      else {
        uVar7 = std::__cxx11::string::compare((char *)&local_228);
        if ((int)uVar7 == 0) {
          if (type == INTERFACE_LIBRARY) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "INTERFACE library specified with conflicting MODULE type.",0x39);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(local_1e0,&local_208);
            goto LAB_00275454;
          }
          type = MODULE_LIBRARY;
        }
        else {
          uVar7 = std::__cxx11::string::compare((char *)&local_228);
          if ((int)uVar7 == 0) {
            if (type == INTERFACE_LIBRARY) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "INTERFACE library specified with conflicting OBJECT type.",0x39);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(local_1e0,&local_208);
              goto LAB_00275454;
            }
            type = OBJECT_LIBRARY;
          }
          else {
            uVar7 = std::__cxx11::string::compare((char *)&local_228);
            if ((int)uVar7 != 0) {
              uVar7 = std::__cxx11::string::compare((char *)&local_228);
              if ((int)uVar7 == 0) {
                if (type == INTERFACE_LIBRARY) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "INTERFACE library specified with conflicting ALIAS type.",0x38);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(local_1e0,&local_208);
                  goto LAB_00275454;
                }
                pbVar13 = pbVar13 + 1;
                iVar12 = 0;
                local_1cc = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
              }
              else {
                uVar7 = std::__cxx11::string::compare((char *)&local_228);
                if ((int)uVar7 == 0) {
                  if ((local_1e4 & 1) == 0) {
                    if ((local_1cc & 1) == 0) {
                      if ((local_1d4 & 1) == 0) {
                        type = INTERFACE_LIBRARY;
                        goto LAB_0027539f;
                      }
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,
                                 "INTERFACE library may not be used with EXCLUDE_FROM_ALL.",0x38);
                      std::__cxx11::stringbuf::str();
                      cmCommand::SetError(local_1e0,&local_208);
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,
                                 "INTERFACE library specified with conflicting ALIAS type.",0x38);
                      std::__cxx11::stringbuf::str();
                      cmCommand::SetError(local_1e0,&local_208);
                    }
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,
                               "INTERFACE library specified with conflicting/multiple types.",0x3c);
                    std::__cxx11::stringbuf::str();
                    cmCommand::SetError(local_1e0,&local_208);
                  }
LAB_0027556a:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208._M_dataplus._M_p != &local_208.field_2) {
                    operator_delete(local_208._M_dataplus._M_p,
                                    local_208.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base(local_138);
                  goto LAB_00275491;
                }
                uVar7 = std::__cxx11::string::compare((char *)pbVar13);
                if ((int)uVar7 == 0) {
                  if (type == INTERFACE_LIBRARY) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,
                               "INTERFACE library may not be used with EXCLUDE_FROM_ALL.",0x38);
                    std::__cxx11::stringbuf::str();
                    cmCommand::SetError(local_1e0,&local_208);
                    goto LAB_00275454;
                  }
                  local_1d4 = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
                }
                else {
                  uVar7 = std::__cxx11::string::compare((char *)pbVar13);
                  if ((int)uVar7 != 0) {
                    if (((local_1e8 & 1) == 0) ||
                       (uVar7 = std::__cxx11::string::compare((char *)pbVar13), (int)uVar7 != 0)) {
                      iVar12 = 3;
                      if (type == INTERFACE_LIBRARY) {
                        iVar4 = std::__cxx11::string::compare((char *)pbVar13);
                        type = INTERFACE_LIBRARY;
                        if (iVar4 == 0) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,
                                     "GLOBAL option may only be used with IMPORTED libraries.",0x37)
                          ;
                          std::__cxx11::stringbuf::str();
                          cmCommand::SetError(local_1e0,&local_208);
                          goto LAB_0027556a;
                        }
                      }
                    }
                    else {
                      pbVar13 = pbVar13 + 1;
                      iVar12 = 0;
                      local_1d0 = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
                    }
                    goto LAB_00275497;
                  }
                  local_1e8 = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
                }
                pbVar13 = pbVar13 + 1;
                iVar12 = 0;
              }
              goto LAB_00275497;
            }
            if (type == INTERFACE_LIBRARY) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "INTERFACE library specified with conflicting UNKNOWN type.",0x3a);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(local_1e0,&local_208);
              goto LAB_00275454;
            }
            type = UNKNOWN_LIBRARY;
          }
        }
      }
LAB_0027539f:
      pbVar13 = pbVar13 + 1;
      iVar12 = 0;
      local_1e4 = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
    }
LAB_00275497:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  } while (iVar12 == 0);
  if (iVar12 != 3) goto LAB_00275dd4;
LAB_002755d1:
  this_01 = local_1e0;
  if (type == INTERFACE_LIBRARY) {
    if (pbVar13 ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      if (((local_1d0 & 1) == 0) || ((local_1e8 & 1) != 0)) goto LAB_002756b5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"INTERFACE library specified as GLOBAL, but not as IMPORTED.",
                 0x3b);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(this_01,&local_228);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"INTERFACE library requires no source arguments.",0x2f);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(this_01,&local_228);
    }
    goto LAB_0027562a;
  }
LAB_002756b5:
  bVar3 = cmGeneratorExpression::IsValidTargetName(&local_1c8);
  if (((!bVar3) || (bVar3 = cmGlobalGenerator::IsReservedTarget(&local_1c8), bVar3)) ||
     (((local_1e8 & 1) == 0 &&
      (((local_1cc & 1) == 0 &&
       (lVar9 = std::__cxx11::string::find((char *)&local_1c8,0x4edb10,0), lVar9 != -1)))))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    PVar5 = cmMakefile::GetPolicyStatus(this_01->Makefile,CMP0037);
    if (2 < PVar5 - NEW) {
      if ((PVar5 == WARN) && (type != INTERFACE_LIBRARY)) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_228,(cmPolicies *)0x25,id);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_228._M_dataplus._M_p,
                            local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        bVar3 = false;
        t = AUTHOR_WARNING;
        goto LAB_00275705;
      }
LAB_002757c5:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      this_01 = local_1e0;
      goto LAB_002757eb;
    }
    t = FATAL_ERROR;
    bVar3 = true;
LAB_00275705:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The target name \"",0x11);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
               ,0x7b);
    pcVar1 = local_1e0->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,t,&local_228,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) goto LAB_002757c5;
LAB_00275791:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
LAB_002757eb:
    if ((local_1cc & 1) == 0) {
      if (((local_1e8 & 1) != 0) && ((local_1d4 & 1) != 0)) {
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"excludeFromAll with IMPORTED target makes no sense.","");
        cmCommand::SetError(this_01,(string *)local_1a8);
        goto LAB_00275daf;
      }
      if ((type & ~STATIC_LIBRARY) != SHARED_LIBRARY) {
LAB_0027590f:
        if ((local_1e8 & 1) == 0) {
          if (type != UNKNOWN_LIBRARY) goto LAB_00275c25;
          pcVar1 = this_01->Makefile;
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,
                     "The UNKNOWN library type may be used only for IMPORTED libraries.","");
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1a8,false);
LAB_00275bf9:
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
          }
          bVar3 = true;
          goto LAB_00275dd6;
        }
LAB_00275b9a:
        if ((local_1e4 & 1) == 0) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"called with IMPORTED argument but no library type.","");
          cmCommand::SetError(this_01,(string *)local_1a8);
          goto LAB_00275daf;
        }
        if (type == INTERFACE_LIBRARY) {
          bVar3 = cmGeneratorExpression::IsValidTargetName(&local_1c8);
          if (!bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Invalid name for IMPORTED INTERFACE library target: ",
                       0x34);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(this_01,&local_228);
            goto LAB_0027562a;
          }
        }
        else if (type == OBJECT_LIBRARY) {
          pcVar1 = this_01->Makefile;
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,
                     "The OBJECT library type may not be used for IMPORTED libraries.","");
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1a8,false);
          goto LAB_00275bf9;
        }
        pcVar10 = cmMakefile::FindTargetToUse(this_01->Makefile,&local_1c8,false);
        if (pcVar10 == (cmTarget *)0x0) {
          bVar3 = true;
          cmMakefile::AddImportedTarget
                    (this_01->Makefile,&local_1c8,type,(bool)((byte)local_1d0 & 1));
          goto LAB_00275dd6;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"cannot create imported target \"",0x1f);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                            local_1c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"\" because another target with the same name already exists.",0x3b);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(this_01,&local_228);
LAB_0027562a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00275791;
      }
      this_00 = cmMakefile::GetState(this_01->Makefile);
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"TARGET_SUPPORTS_SHARED_LIBS","");
      bVar3 = cmState::GetGlobalPropertyAsBool(this_00,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      if (bVar3) goto LAB_0027590f;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ADD_LIBRARY called with ",0x18);
      pcVar6 = "MODULE";
      if (type == SHARED_LIBRARY) {
        pcVar6 = "SHARED";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 " option but the target platform does not support dynamic linking. Building a STATIC library instead. This may lead to problems."
                 ,0x7f);
      pcVar1 = this_01->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_228,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      type = STATIC_LIBRARY;
      if ((local_1e8 & 1) != 0) goto LAB_00275b9a;
LAB_00275c25:
      local_1a8._0_8_ = local_1a8 + 0x10;
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      bVar3 = cmMakefile::EnforceUniqueName(this_01->Makefile,&local_1c8,(string *)local_1a8,false);
      if (!bVar3) {
        cmCommand::SetError(this_01,(string *)local_1a8);
        goto LAB_00275daf;
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      local_208._M_dataplus._M_p = (pointer)0x0;
      local_208._M_string_length = 0;
      local_208.field_2._M_allocated_capacity = 0;
      if (type == INTERFACE_LIBRARY) {
        bVar3 = cmGeneratorExpression::IsValidTargetName(&local_1c8);
        if ((bVar3) &&
           (lVar9 = std::__cxx11::string::find((char *)&local_1c8,0x4c54fc,0), lVar9 == -1)) {
          type = INTERFACE_LIBRARY;
          goto LAB_0027612d;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Invalid name for INTERFACE library target: ",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(this_01,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar3 = false;
      }
      else {
        pbVar11 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar13 == pbVar11) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"You have called ADD_LIBRARY for library ","");
          std::__cxx11::string::_M_append
                    (local_1a8,
                     (ulong)(((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
          std::__cxx11::string::append(local_1a8);
          std::__cxx11::string::append(local_1a8);
          cmSystemTools::Message((char *)local_1a8._0_8_,"Warning");
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
          }
          pbVar11 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208,
                   local_208._M_string_length,pbVar13,pbVar11);
LAB_0027612d:
        bVar3 = true;
        cmMakefile::AddLibrary
                  (this_01->Makefile,&local_1c8,type,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_208,(bool)((byte)local_1d4 & 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_208);
      goto LAB_00275dd6;
    }
    bVar3 = cmGeneratorExpression::IsValidTargetName(&local_1c8);
    if (bVar3) {
      if ((local_1d4 & 1) == 0) {
        if (((local_1e8 & 1) == 0) && ((local_1d0 & 1) == 0)) {
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start == 0x60) {
            pcVar6 = (pbVar13->_M_dataplus)._M_p;
            pcVar1 = this_01->Makefile;
            std::__cxx11::string::string((string *)local_1a8,pcVar6,(allocator *)&local_228);
            bVar3 = cmMakefile::IsAlias(pcVar1,(string *)local_1a8);
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1
                             );
            }
            if (bVar3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"cannot create ALIAS target \"",0x1c);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                                  local_1c8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" because target \"",0x12)
              ;
              poVar8 = std::operator<<(poVar8,pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"\" is itself an ALIAS.",0x15);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(this_01,&local_228);
              goto LAB_0027562a;
            }
            pcVar1 = this_01->Makefile;
            std::__cxx11::string::string((string *)local_1a8,pcVar6,(allocator *)&local_228);
            pcVar10 = cmMakefile::FindTargetToUse(pcVar1,(string *)local_1a8,true);
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1
                             );
            }
            if (pcVar10 == (cmTarget *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"cannot create ALIAS target \"",0x1c);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                                  local_1c8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" because target \"",0x12)
              ;
              poVar8 = std::operator<<(poVar8,pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"\" does not already exist.",0x19);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(this_01,&local_228);
              goto LAB_0027562a;
            }
            if ((3 < pcVar10->TargetTypeValue - STATIC_LIBRARY) &&
               (pcVar10->TargetTypeValue != INTERFACE_LIBRARY)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"cannot create ALIAS target \"",0x1c);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                                  local_1c8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" because target \"",0x12)
              ;
              poVar8 = std::operator<<(poVar8,pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" is not a library.",0x13)
              ;
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(this_01,&local_228);
              goto LAB_0027562a;
            }
            if (pcVar10->IsImportedTarget == true) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"cannot create ALIAS target \"",0x1c);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                                  local_1c8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" because target \"",0x12)
              ;
              poVar8 = std::operator<<(poVar8,pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" is IMPORTED.",0xe);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(this_01,&local_228);
              goto LAB_0027562a;
            }
            pcVar1 = this_01->Makefile;
            std::__cxx11::string::string((string *)local_1a8,pcVar6,(allocator *)&local_228);
            cmMakefile::AddAlias(pcVar1,&local_1c8,(string *)local_1a8);
            goto LAB_00275bf9;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ALIAS requires exactly one target argument.",0x2b);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(this_01,&local_228);
          goto LAB_0027562a;
        }
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"IMPORTED with ALIAS is not allowed.","");
        cmCommand::SetError(this_01,(string *)local_1a8);
      }
      else {
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"EXCLUDE_FROM_ALL with ALIAS makes no sense.","");
        cmCommand::SetError(this_01,(string *)local_1a8);
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "Invalid name for ALIAS: ",&local_1c8);
      cmCommand::SetError(this_01,(string *)local_1a8);
    }
LAB_00275daf:
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    }
  }
LAB_00275dd4:
  bVar3 = false;
LAB_00275dd6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmAddLibraryCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  // Library type defaults to value of BUILD_SHARED_LIBS, if it exists,
  // otherwise it defaults to static library.
  cmState::TargetType type = cmState::SHARED_LIBRARY;
  if (cmSystemTools::IsOff(this->Makefile->GetDefinition("BUILD_SHARED_LIBS")))
    {
    type = cmState::STATIC_LIBRARY;
    }
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;

  std::vector<std::string>::const_iterator s = args.begin();

  std::string libName = *s;

  ++s;

  // If the second argument is "SHARED" or "STATIC", then it controls
  // the type of library.  Otherwise, it is treated as a source or
  // source list name. There may be two keyword arguments, check for them
  bool haveSpecifiedType = false;
  bool isAlias = false;
  while ( s != args.end() )
    {
    std::string libType = *s;
    if(libType == "STATIC")
      {
      if (type == cmState::INTERFACE_LIBRARY)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting STATIC type.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      type = cmState::STATIC_LIBRARY;
      haveSpecifiedType = true;
      }
    else if(libType == "SHARED")
      {
      if (type == cmState::INTERFACE_LIBRARY)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting SHARED type.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      type = cmState::SHARED_LIBRARY;
      haveSpecifiedType = true;
      }
    else if(libType == "MODULE")
      {
      if (type == cmState::INTERFACE_LIBRARY)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting MODULE type.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      type = cmState::MODULE_LIBRARY;
      haveSpecifiedType = true;
      }
    else if(libType == "OBJECT")
      {
      if (type == cmState::INTERFACE_LIBRARY)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting OBJECT type.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      type = cmState::OBJECT_LIBRARY;
      haveSpecifiedType = true;
      }
    else if(libType == "UNKNOWN")
      {
      if (type == cmState::INTERFACE_LIBRARY)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting UNKNOWN type.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      type = cmState::UNKNOWN_LIBRARY;
      haveSpecifiedType = true;
      }
    else if(libType == "ALIAS")
      {
      if (type == cmState::INTERFACE_LIBRARY)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      isAlias = true;
      }
    else if(libType == "INTERFACE")
      {
      if (haveSpecifiedType)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting/multiple types.";
        this->SetError(e.str());
        return false;
        }
      if (isAlias)
        {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
        }
      if (excludeFromAll)
        {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      type = cmState::INTERFACE_LIBRARY;
      haveSpecifiedType = true;
      }
    else if(*s == "EXCLUDE_FROM_ALL")
      {
      if (type == cmState::INTERFACE_LIBRARY)
        {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
        }
      ++s;
      excludeFromAll = true;
      }
    else if(*s == "IMPORTED")
      {
      ++s;
      importTarget = true;
      }
    else if(importTarget && *s == "GLOBAL")
      {
      ++s;
      importGlobal = true;
      }
    else if(type == cmState::INTERFACE_LIBRARY && *s == "GLOBAL")
      {
      std::ostringstream e;
      e << "GLOBAL option may only be used with IMPORTED libraries.";
      this->SetError(e.str());
      return false;
      }
    else
      {
      break;
      }
    }

  if (type == cmState::INTERFACE_LIBRARY)
    {
    if (s != args.end())
      {
      std::ostringstream e;
      e << "INTERFACE library requires no source arguments.";
      this->SetError(e.str());
      return false;
      }
    if (importGlobal && !importTarget)
      {
      std::ostringstream e;
      e << "INTERFACE library specified as GLOBAL, but not as IMPORTED.";
      this->SetError(e.str());
      return false;
      }
    }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(libName) &&
    !cmGlobalGenerator::IsReservedTarget(libName);

  if (nameOk && !importTarget && !isAlias)
    {
    nameOk = libName.find(":") == std::string::npos;
    }
  if (!nameOk)
    {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0037))
      {
      case cmPolicies::WARN:
        if(type != cmState::INTERFACE_LIBRARY)
          {
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
          issueMessage = true;
          }
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
      }
    if (issueMessage)
      {
      e << "The target name \"" << libName <<
          "\" is reserved or not valid for certain "
          "CMake features, such as generator expressions, and may result "
          "in undefined behavior.";
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }

  if (isAlias)
    {
    if(!cmGeneratorExpression::IsValidTargetName(libName))
      {
      this->SetError("Invalid name for ALIAS: " + libName);
      return false;
      }
    if(excludeFromAll)
      {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
      }
    if(importTarget || importGlobal)
      {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
      }
    if(args.size() != 3)
      {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
      }

    const char *aliasedName = s->c_str();
    if(this->Makefile->IsAlias(aliasedName))
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName
        << "\" because target \"" << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
      }
    cmTarget *aliasedTarget =
                    this->Makefile->FindTargetToUse(aliasedName, true);
    if(!aliasedTarget)
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName
        << "\" because target \"" << aliasedName << "\" does not already "
        "exist.";
      this->SetError(e.str());
      return false;
      }
    cmState::TargetType aliasedType = aliasedTarget->GetType();
    if(aliasedType != cmState::SHARED_LIBRARY
        && aliasedType != cmState::STATIC_LIBRARY
        && aliasedType != cmState::MODULE_LIBRARY
        && aliasedType != cmState::OBJECT_LIBRARY
        && aliasedType != cmState::INTERFACE_LIBRARY)
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName
        << "\" because target \"" << aliasedName << "\" is not a library.";
      this->SetError(e.str());
      return false;
      }
    if(aliasedTarget->IsImported())
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName
        << "\" because target \"" << aliasedName << "\" is IMPORTED.";
      this->SetError(e.str());
      return false;
      }
    this->Makefile->AddAlias(libName, aliasedName);
    return true;
    }

  if(importTarget && excludeFromAll)
    {
    this->SetError("excludeFromAll with IMPORTED target makes no sense.");
    return false;
    }

  /* ideally we should check whether for the linker language of the target
    CMAKE_${LANG}_CREATE_SHARED_LIBRARY is defined and if not default to
    STATIC. But at this point we know only the name of the target, but not
    yet its linker language. */
  if ((type == cmState::SHARED_LIBRARY ||
       type == cmState::MODULE_LIBRARY) &&
       (this->Makefile->GetState()->GetGlobalPropertyAsBool(
                                      "TARGET_SUPPORTS_SHARED_LIBS") == false))
    {
    std::ostringstream w;
    w <<
      "ADD_LIBRARY called with " <<
      (type==cmState::SHARED_LIBRARY ? "SHARED" : "MODULE") <<
      " option but the target platform does not support dynamic linking. "
      "Building a STATIC library instead. This may lead to problems.";
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
    type = cmState::STATIC_LIBRARY;
    }

  // Handle imported target creation.
  if(importTarget)
    {
    // The IMPORTED signature requires a type to be specified explicitly.
    if (!haveSpecifiedType)
      {
      this->SetError("called with IMPORTED argument but no library type.");
      return false;
      }
    if(type == cmState::OBJECT_LIBRARY)
      {
      this->Makefile->IssueMessage(
        cmake::FATAL_ERROR,
        "The OBJECT library type may not be used for IMPORTED libraries."
        );
      return true;
      }
    if(type == cmState::INTERFACE_LIBRARY)
      {
      if (!cmGeneratorExpression::IsValidTargetName(libName))
        {
        std::ostringstream e;
        e << "Invalid name for IMPORTED INTERFACE library target: " << libName;
        this->SetError(e.str());
        return false;
        }
      }

    // Make sure the target does not already exist.
    if(this->Makefile->FindTargetToUse(libName))
      {
      std::ostringstream e;
      e << "cannot create imported target \"" << libName
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
      }

    // Create the imported target.
    this->Makefile->AddImportedTarget(libName, type, importGlobal);
    return true;
    }

  // A non-imported target may not have UNKNOWN type.
  if(type == cmState::UNKNOWN_LIBRARY)
    {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR,
      "The UNKNOWN library type may be used only for IMPORTED libraries."
      );
    return true;
    }

  // Enforce name uniqueness.
  {
  std::string msg;
  if(!this->Makefile->EnforceUniqueName(libName, msg))
    {
    this->SetError(msg);
    return false;
    }
  }

  std::vector<std::string> srclists;

  if(type == cmState::INTERFACE_LIBRARY)
    {
    if (!cmGeneratorExpression::IsValidTargetName(libName)
        || libName.find("::") != std::string::npos)
      {
      std::ostringstream e;
      e << "Invalid name for INTERFACE library target: " << libName;
      this->SetError(e.str());
      return false;
      }

    this->Makefile->AddLibrary(libName,
                               type,
                               srclists,
                               excludeFromAll);
    return true;
    }

  if (s == args.end())
    {
    std::string msg = "You have called ADD_LIBRARY for library ";
    msg += args[0];
    msg += " without any source files. This typically indicates a problem ";
    msg += "with your CMakeLists.txt file";
    cmSystemTools::Message(msg.c_str() ,"Warning");
    }

  srclists.insert(srclists.end(), s, args.end());

  this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);

  return true;
}